

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O1

void __thiscall ImGuiTabBar::ImGuiTabBar(ImGuiTabBar *this)

{
  (this->BarRect).Min.x = 0.0;
  (this->BarRect).Min.y = 0.0;
  (this->BarRect).Max.x = 0.0;
  (this->BarRect).Max.y = 0.0;
  (this->Tabs).Size = 0;
  (this->Tabs).Capacity = 0;
  (this->Tabs).Data = (ImGuiTabItem *)0x0;
  this->ID = 0;
  this->SelectedTabId = 0;
  this->NextSelectedTabId = 0;
  this->VisibleTabId = 0;
  (this->FramePadding).x = 0.0;
  (this->FramePadding).y = 0.0;
  (this->TabsNames).Buf.Size = 0;
  (this->TabsNames).Buf.Capacity = 0;
  (this->TabsNames).Buf.Data = (char *)0x0;
  this->CurrFrameVisible = -1;
  this->PrevFrameVisible = -1;
  this->LastTabContentHeight = 0.0;
  this->OffsetMax = 0.0;
  this->OffsetMaxIdeal = 0.0;
  this->OffsetNextTab = 0.0;
  this->ScrollingAnim = 0.0;
  this->ScrollingTarget = 0.0;
  this->ScrollingTargetDistToVisibility = 0.0;
  this->ScrollingSpeed = 0.0;
  *(undefined8 *)((long)&this->ScrollingTargetDistToVisibility + 3) = 0;
  *(undefined8 *)((long)&this->Flags + 3) = 0;
  this->LastTabItemIdx = -1;
  return;
}

Assistant:

ImVec2(float _x, float _y)              { x = _x; y = _y; }